

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::draw_elements_invalid_program
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  undefined1 local_18 [4];
  GLuint local_14;
  GLfloat vertices [1];
  GLuint fbo;
  NegativeTestContext *ctx_local;
  
  _vertices = ctx;
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  pNVar1 = _vertices;
  local_14 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_INVALID_ENUM is generated if mode is not an accepted value.",
             &local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glDrawElements(&_vertices->super_CallLogWrapper,0xffffffff,1,0x1401,local_18)
  ;
  NegativeTestContext::expectError(_vertices,0x500);
  NegativeTestContext::endSection(_vertices);
  pNVar1 = _vertices;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_ENUM is generated if type is not one of the accepted values.",&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glDrawElements(&_vertices->super_CallLogWrapper,0,1,0xffffffff,local_18);
  NegativeTestContext::expectError(_vertices,0x500);
  glu::CallLogWrapper::glDrawElements(&_vertices->super_CallLogWrapper,0,1,0x1406,local_18);
  NegativeTestContext::expectError(_vertices,0x500);
  NegativeTestContext::endSection(_vertices);
  pNVar1 = _vertices;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"GL_INVALID_VALUE is generated if count is negative.",&local_99);
  NegativeTestContext::beginSection(pNVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glDrawElements(&_vertices->super_CallLogWrapper,0,-1,0x1401,local_18);
  NegativeTestContext::expectError(_vertices,0x501);
  NegativeTestContext::endSection(_vertices);
  pNVar1 = _vertices;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
             ,&local_c1);
  NegativeTestContext::beginSection(pNVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  glu::CallLogWrapper::glGenFramebuffers(&_vertices->super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindFramebuffer(&_vertices->super_CallLogWrapper,0x8d40,local_14);
  glu::CallLogWrapper::glCheckFramebufferStatus(&_vertices->super_CallLogWrapper,0x8d40);
  glu::CallLogWrapper::glDrawElements(&_vertices->super_CallLogWrapper,0,1,0x1401,local_18);
  NegativeTestContext::expectError(_vertices,0x506);
  glu::CallLogWrapper::glBindFramebuffer(&_vertices->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteFramebuffers(&_vertices->super_CallLogWrapper,1,&local_14);
  NegativeTestContext::endSection(_vertices);
  return;
}

Assistant:

void draw_elements_invalid_program (NegativeTestContext& ctx)
{
	ctx.glUseProgram(0);
	GLuint	fbo = 0;
	GLfloat	vertices[1];

	ctx.beginSection("GL_INVALID_ENUM is generated if mode is not an accepted value.");
	ctx.glDrawElements(-1, 1, GL_UNSIGNED_BYTE, vertices);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if type is not one of the accepted values.");
	ctx.glDrawElements(GL_POINTS, 1, -1, vertices);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glDrawElements(GL_POINTS, 1, GL_FLOAT, vertices);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if count is negative.");
	ctx.glDrawElements(GL_POINTS, -1, GL_UNSIGNED_BYTE, vertices);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.glDrawElements(GL_POINTS, 1, GL_UNSIGNED_BYTE, vertices);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.endSection();
}